

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O2

void HeadLossModel::addCVHeadLoss(double q,double *headLoss,double *gradient)

{
  double dVar1;
  double dVar2;
  
  dVar1 = q * 100000000.0;
  dVar2 = SQRT(dVar1 * dVar1 + 1e-06);
  *headLoss = (dVar1 - dVar2) * 0.5 + *headLoss;
  *gradient = (1.0 - dVar1 / dVar2) * 100000000.0 * 0.5 + *gradient;
  return;
}

Assistant:

void HeadLossModel::addCVHeadLoss(double q, double& headLoss, double& gradient)
{
    double a = HIGH_RESISTANCE * q;
    double b = sqrt(a*a + HEAD_EPSILON);
    headLoss += (a - b) / 2.0;
    gradient += HIGH_RESISTANCE * ( 1.0 - a/b) / 2.0;
}